

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>
  *pFVar3;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4
  ;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar10;
  double *pdVar11;
  ulong uVar12;
  value_type vVar13;
  
  pFVar3 = (((fadexpr->fadexpr_).right_)->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  uVar1 = ((*(Fad<double> **)((long)&((pFVar4->fadexpr_).left_)->fadexpr_ + 0x10))->dx_).num_elts;
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 <= (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (this->dx_).num_elts;
  if (uVar2 != uVar1) {
    if (uVar2 == 0) {
      if (uVar1 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar1 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar2;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar2) {
        uVar12 = (long)(int)uVar2 << 3;
      }
      pdVar11 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar11;
    }
  }
  if (uVar2 != 0) {
    pdVar11 = (this->dx_).ptr_to_data;
    pFVar3 = (((fadexpr->fadexpr_).right_)->fadexpr_).left_;
    pFVar4 = (pFVar3->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).left_;
    pFVar6 = *(Fad<double> **)((long)&pFVar5->fadexpr_ + 0x10);
    if ((((pFVar6->dx_).num_elts == 0) || ((((pFVar4->fadexpr_).right_)->dx_).num_elts == 0)) ||
       ((((pFVar3->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar2) {
        uVar12 = 0;
        do {
          vVar13 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>
                   ::dx(&((((fadexpr->fadexpr_).right_)->fadexpr_).left_)->fadexpr_,(int)uVar12);
          pdVar11[uVar12] = vVar13 * (fadexpr->fadexpr_).left_.constant_;
          uVar12 = uVar12 + 1;
        } while (uVar2 != uVar12);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar7 = *(double **)((long)&pFVar6->dx_ + 8);
      pdVar8 = (((pFVar4->fadexpr_).right_)->dx_).ptr_to_data;
      pdVar9 = (((pFVar3->fadexpr_).right_)->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        pdVar11[uVar12] =
             (pdVar7[uVar12] * (pFVar5->fadexpr_).left_.constant_ + pdVar8[uVar12] + pdVar9[uVar12])
             * (fadexpr->fadexpr_).left_.constant_;
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
    }
  }
  pFVar10 = (fadexpr->fadexpr_).right_;
  pFVar3 = (pFVar10->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  this->val_ = (((pFVar5->fadexpr_).left_.constant_ *
                 (*(Fad<double> **)((long)&pFVar5->fadexpr_ + 0x10))->val_ +
                 ((pFVar4->fadexpr_).right_)->val_ + ((pFVar3->fadexpr_).right_)->val_) -
               (pFVar10->fadexpr_).right_.constant_) * (fadexpr->fadexpr_).left_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}